

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  ExceptionGuard local_28;
  
  local_28.start = pos;
  for (; local_28.pos = pos, start != end; start = (Entry *)&(start->value).isSourcePrefix) {
    HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry::Entry
              ((Entry *)pos,start);
    pos = (Entry *)&((local_28.pos)->value).isSourcePrefix;
  }
  local_28.start = pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }